

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

SpectrumTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTextureOrNull
          (TextureParameterDictionary *this,string *name,SpectrumType spectrumType,Allocator alloc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  *this_00;
  undefined4 extraout_var;
  const_iterator cVar8;
  RGBIlluminantSpectrum *pRVar9;
  ulong uVar10;
  undefined4 extraout_var_00;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pcVar11;
  char *pcVar12;
  memory_resource *in_R8;
  long lVar13;
  float fVar14;
  Allocator alloc_local;
  SpectrumHandle s;
  undefined8 local_38;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_00000014,spectrumType);
  iVar7 = (int)alloc.memoryResource;
  if (iVar7 == 1) {
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
               *)(name->_M_string_length + 0x60);
  }
  else if (iVar7 == 0) {
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
               *)(name->_M_string_length + 0x30);
  }
  else {
    this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
               *)(name->_M_string_length + 0x90);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar2 = *(long *)(pcVar1 + 0x58);
  pcVar11 = pcVar1 + 0x10;
  if (*(pointer *)(pcVar1 + 8) != (pointer)0x0) {
    pcVar11 = *(pointer *)(pcVar1 + 8);
  }
  lVar13 = 0;
  alloc_local.memoryResource = in_R8;
  do {
    if (lVar2 << 3 == lVar13) {
      this->dict = (ParameterDictionary *)0x0;
      return (SpectrumTextureHandle)
             (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              )this;
    }
    __lhs_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (pcVar11 + lVar13);
    __lhs = __lhs_00 + 1;
    bVar6 = std::operator!=(__lhs,__rhs);
    if (!bVar6) {
      bVar6 = std::operator==(__lhs_00,"texture");
      if (bVar6) {
        if (__lhs_00[4].field_2._M_allocated_capacity != 1) {
          if (__lhs_00[4].field_2._M_allocated_capacity == 0) {
            pcVar12 = "No texture name provided for parameter \"%s\".";
          }
          else {
            pcVar12 = "More than one texture name provided for parameter \"%s\".";
          }
          ErrorExit<std::__cxx11::string_const&>((FileLoc *)(__lhs_00 + 2),pcVar12,__rhs);
        }
        __lhs_00[5].field_2._M_local_buf[8] = '\x01';
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                ::find(this_00,(key_type *)__lhs_00[4]._M_dataplus._M_p);
        if ((_Rb_tree_header *)cVar8._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
          this->dict = *(ParameterDictionary **)(cVar8._M_node + 2);
          return (SpectrumTextureHandle)
                 (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                  )this;
        }
        ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((FileLoc *)(__lhs_00 + 2),
                   "Couldn\'t find spectrum texture named \"%s\" for parameter \"%s\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __lhs_00[4]._M_dataplus._M_p,__lhs);
      }
      bVar6 = std::operator==(__lhs_00,"rgb");
      if (bVar6) {
        if (__lhs_00[3].field_2._M_allocated_capacity == 3) {
          __lhs_00[5].field_2._M_local_buf[8] = '\x01';
          pauVar3 = (undefined1 (*) [16])__lhs_00[3]._M_dataplus._M_p;
          fVar14 = (float)*(double *)pauVar3[1];
          auVar4 = vcvtpd2ps_avx(*pauVar3);
          s.
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
          .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                   )vmovlps_avx(auVar4);
          if (0.0 <= auVar4._0_4_) {
            auVar5 = vmovshdup_avx(auVar4);
            if ((0.0 <= auVar5._0_4_) && (0.0 <= fVar14)) {
              if (iVar7 == 2) {
                pRVar9 = pstd::pmr::polymorphic_allocator<std::byte>::
                         new_object<pbrt::RGBIlluminantSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                                   (&alloc_local,
                                    *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60),(RGB *)&s);
                uVar10 = 0x6000000000000;
              }
              else if (iVar7 == 1) {
                pRVar9 = (RGBIlluminantSpectrum *)
                         pstd::pmr::polymorphic_allocator<std::byte>::
                         new_object<pbrt::RGBUnboundedSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                                   (&alloc_local,
                                    *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60),(RGB *)&s);
                uVar10 = 0x5000000000000;
              }
              else {
                if (iVar7 != 0) {
                  LogFatal<char_const(&)[37]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/paramdict.cpp"
                             ,0x34e,"Check failed: %s",
                             (char (*) [37])"spectrumType == SpectrumType::Albedo");
                }
                if (((1.0 < auVar4._0_4_) || (1.0 < auVar5._0_4_)) || (1.0 < fVar14)) {
                  pcVar12 = "RGB parameter \"%s\" used as an albedo has > 1 component.";
                  goto LAB_0032b6c8;
                }
                pRVar9 = (RGBIlluminantSpectrum *)
                         pstd::pmr::polymorphic_allocator<std::byte>::
                         new_object<pbrt::RGBAlbedoSpectrum,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                                   (&alloc_local,
                                    *(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60),(RGB *)&s);
                uVar10 = 0x4000000000000;
              }
              iVar7 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                                (alloc_local.memoryResource,8);
              *(ulong *)CONCAT44(extraout_var_00,iVar7) = (ulong)pRVar9 | uVar10;
              this->dict = (ParameterDictionary *)
                           (CONCAT44(extraout_var_00,iVar7) | 0x5000000000000);
              return (SpectrumTextureHandle)
                     (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                      )this;
            }
          }
          pcVar12 = "Negative value provided for RGB parameter \"%s\".";
        }
        else {
          pcVar12 = "Didn\'t find three values for \"rgb\" parameter \"%s\".";
        }
LAB_0032b6c8:
        ErrorExit<std::__cxx11::string_const&>((FileLoc *)(__lhs_00 + 2),pcVar12,__lhs);
      }
      bVar6 = std::operator==(__lhs_00,"spectrum");
      if ((bVar6) || (bVar6 = std::operator==(__lhs_00,"blackbody"), bVar6)) {
        local_38 = 0;
        GetOneSpectrum((TextureParameterDictionary *)&s,name,(SpectrumHandle *)__rhs,
                       (SpectrumType)&local_38,
                       (memory_resource *)((ulong)alloc.memoryResource & 0xffffffff));
        if (s.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            .bits != 0) {
          iVar7 = (*in_R8->_vptr_memory_resource[2])(in_R8,8);
          ((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
            *)CONCAT44(extraout_var,iVar7))->bits =
               (uintptr_t)
               s.
               super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               .bits;
          this->dict = (ParameterDictionary *)(CONCAT44(extraout_var,iVar7) | 0x5000000000000);
          return (SpectrumTextureHandle)
                 (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                  )this;
        }
        LogFatal<char_const(&)[13]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/paramdict.cpp"
                   ,0x358,"Check failed: %s",(char (*) [13])"s != nullptr");
      }
    }
    lVar13 = lVar13 + 8;
  } while( true );
}

Assistant:

SpectrumTextureHandle TextureParameterDictionary::GetSpectrumTextureOrNull(
    const std::string &name, SpectrumType spectrumType, Allocator alloc) const {
    const auto &spectrumTextures = (spectrumType == SpectrumType::Unbounded)
                                       ? textures->unboundedSpectrumTextures
                                       : ((spectrumType == SpectrumType::Albedo)
                                              ? textures->albedoSpectrumTextures
                                              : textures->illuminantSpectrumTextures);

    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = spectrumTextures.find(p->strings[0]);
            if (iter != spectrumTextures.end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find spectrum texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "rgb") {
            if (p->numbers.size() != 3)
                ErrorExit(&p->loc,
                          "Didn't find three values for \"rgb\" parameter \"%s\".",
                          p->name);
            p->lookedUp = true;

            RGB rgb(p->numbers[0], p->numbers[1], p->numbers[2]);
            if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                ErrorExit(&p->loc, "Negative value provided for RGB parameter \"%s\".",
                          p->name);
            SpectrumHandle s;
            if (spectrumType == SpectrumType::Illuminant)
                s = alloc.new_object<RGBIlluminantSpectrum>(*dict->ColorSpace(), rgb);
            else if (spectrumType == SpectrumType::Unbounded)
                s = alloc.new_object<RGBUnboundedSpectrum>(*dict->ColorSpace(), rgb);
            else {
                CHECK(spectrumType == SpectrumType::Albedo);
                if (rgb.r > 1 || rgb.g > 1 || rgb.b > 1)
                    ErrorExit(&p->loc,
                              "RGB parameter \"%s\" used as an albedo has > 1 component.",
                              p->name);
                s = alloc.new_object<RGBAlbedoSpectrum>(*dict->ColorSpace(), rgb);
            }
            return alloc.new_object<SpectrumConstantTexture>(s);
        } else if (p->type == "spectrum" || p->type == "blackbody") {
            SpectrumHandle s = GetOneSpectrum(name, nullptr, spectrumType, alloc);
            CHECK(s != nullptr);
            return alloc.new_object<SpectrumConstantTexture>(s);
        }
    }

    return nullptr;
}